

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O2

size_t CLI::detail::close_sequence(string *str,size_t start,char closure_char)

{
  char cVar1;
  long lVar2;
  size_t sVar3;
  undefined7 in_register_00000011;
  ulong uVar4;
  string closures;
  
  lVar2 = ::std::__cxx11::string::find('h',CONCAT71(in_register_00000011,closure_char) & 0xffffffff)
  ;
  if ((lVar2 - 1U < 2) || (lVar2 == -1)) {
    sVar3 = close_literal_quote(str,start,closure_char);
    return sVar3;
  }
  if (lVar2 == 0) {
    sVar3 = close_string_quote(str,start,closure_char);
    return sVar3;
  }
  closures._M_dataplus._M_p = (pointer)&closures.field_2;
  ::std::__cxx11::string::_M_construct((ulong)&closures,'\x01');
  while( true ) {
    start = start + 1;
    uVar4 = str->_M_string_length;
    if (str->_M_string_length <= start) break;
    cVar1 = (str->_M_dataplus)._M_p[start];
    if (cVar1 == closures._M_dataplus._M_p[closures._M_string_length - 1]) {
      ::std::__cxx11::string::pop_back();
      uVar4 = start;
      if (closures._M_string_length == 0) break;
      cVar1 = (str->_M_dataplus)._M_p[start];
    }
    lVar2 = ::std::__cxx11::string::find('H',(ulong)(uint)(int)cVar1);
    if (lVar2 - 1U < 2) {
      start = close_literal_quote(str,start,(str->_M_dataplus)._M_p[start]);
    }
    else if (lVar2 != -1) {
      if (lVar2 == 0) {
        start = close_string_quote(str,start,(str->_M_dataplus)._M_p[start]);
      }
      else {
        ::std::__cxx11::string::push_back((char)&closures);
      }
    }
  }
  ::std::__cxx11::string::~string((string *)&closures);
  return uVar4;
}

Assistant:

CLI11_INLINE std::size_t close_sequence(const std::string &str, std::size_t start, char closure_char) {

    auto bracket_loc = matchBracketChars.find(closure_char);
    switch(bracket_loc) {
    case 0:
        return close_string_quote(str, start, closure_char);
    case 1:
    case 2:
#if defined(_MSC_VER) && _MSC_VER < 1920
    case(std::size_t)-1:
#else
    case std::string::npos:
#endif
        return close_literal_quote(str, start, closure_char);
    default:
        break;
    }

    std::string closures(1, closure_char);
    auto loc = start + 1;

    while(loc < str.size()) {
        if(str[loc] == closures.back()) {
            closures.pop_back();
            if(closures.empty()) {
                return loc;
            }
        }
        bracket_loc = bracketChars.find(str[loc]);
        if(bracket_loc != std::string::npos) {
            switch(bracket_loc) {
            case 0:
                loc = close_string_quote(str, loc, str[loc]);
                break;
            case 1:
            case 2:
                loc = close_literal_quote(str, loc, str[loc]);
                break;
            default:
                closures.push_back(matchBracketChars[bracket_loc]);
                break;
            }
        }
        ++loc;
    }
    if(loc > str.size()) {
        loc = str.size();
    }
    return loc;
}